

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void x86_64_ploadi(dill_stream s,int type,int junk,int dest,int src,long offset)

{
  dill_stream_conflict s_00;
  uint in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  dill_stream in_R9;
  int float_op;
  int rex;
  x86_64_mach_info_conflict smi;
  int tmp_dest;
  uchar opcode;
  uint in_stack_ffffffffffffffa8;
  uint insn3;
  int in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int insn1;
  undefined8 in_stack_ffffffffffffffb8;
  int r;
  int iVar1;
  uint rex_00;
  int src_00;
  dill_stream s_01;
  uint uVar2;
  undefined3 in_stack_ffffffffffffffdc;
  int op;
  
  op = CONCAT13(ld_opcodes[(int)in_ESI],in_stack_ffffffffffffffdc);
  s_01 = *(dill_stream *)(*(long *)(in_RDI + 8) + 0xf0);
  rex_00 = 0;
  iVar1 = 0;
  if (((in_ESI == 6) || (in_ESI == 7)) || (in_ESI == 8)) {
    rex_00 = 8;
  }
  s_00 = (dill_stream_conflict)(ulong)in_ESI;
  uVar2 = in_ECX;
  switch(s_00) {
  case (dill_stream_conflict)0x0:
  case (dill_stream_conflict)0x1:
    if (3 < (int)in_ECX) {
      uVar2 = 0;
    }
    if (in_ESI == 1) {
      if (in_R8D == uVar2) {
        uVar2 = 0;
      }
      x86_64_clear((dill_stream)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
    }
    break;
  case (dill_stream_conflict)0x2:
  case (dill_stream_conflict)0x3:
    if (in_ESI == 3) {
      if (in_R8D == in_ECX) {
        uVar2 = 0;
      }
      x86_64_clear((dill_stream)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
    }
    if (*(ulong *)(*(long *)(in_RDI + 8) + 0x10) <= *(ulong *)(*(long *)(in_RDI + 8) + 8)) {
      extend_dill_stream(s_00);
    }
    **(undefined1 **)(*(long *)(in_RDI + 8) + 8) = 0x66;
    if (*(int *)(in_RDI + 0x18) != 0) {
      dump_cur_dill_insn((dill_stream_conflict)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 1;
    break;
  case (dill_stream_conflict)0x6:
  case (dill_stream_conflict)0x7:
  case (dill_stream_conflict)0x8:
  default:
    break;
  case (dill_stream_conflict)0x9:
    iVar1 = 0xf3;
    break;
  case (dill_stream_conflict)0xa:
    iVar1 = 0xf2;
  }
  if ((char)s_01[1].dill_param_reg_pointer != '\0') {
    if (*(ulong *)(*(long *)(in_RDI + 8) + 0x10) <= *(ulong *)(*(long *)(in_RDI + 8) + 8)) {
      extend_dill_stream(s_00);
    }
    **(undefined1 **)(*(long *)(in_RDI + 8) + 8) = (char)s_01[1].dill_param_reg_pointer;
    if (*(int *)(in_RDI + 0x18) != 0) {
      dump_cur_dill_insn((dill_stream_conflict)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 1;
    *(undefined1 *)&s_01[1].dill_param_reg_pointer = 0;
  }
  if (7 < (int)in_R8D) {
    rex_00 = rex_00 | 1;
  }
  if (7 < (int)uVar2) {
    rex_00 = rex_00 | 4;
  }
  insn1 = (int)in_stack_ffffffffffffffb8;
  src_00 = (int)s_01;
  r = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  insn3 = (uint)in_R9;
  if (((in_R8D & 7) == 4) &&
     ((((ulong)in_R9 & 0xffffffff80000000) == 0 ||
      (((ulong)in_R9 & 0xffffffff80000000) == 0xffffffff80000000)))) {
    if (in_R9 == (dill_stream)0x0) {
      if (iVar1 == 0) {
        BYTE_OUT3R(s_00,r,insn1,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
      }
      else {
        in_stack_ffffffffffffffa8 = in_R8D & 7 | 0x20;
        BYTE_OUT1R4(s_00,r,insn1,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffac,src_00);
      }
    }
    else if (((long)in_R9 < 0x80) && (-0x80 < (long)in_R9)) {
      if (iVar1 == 0) {
        BYTE_OUT4R(s_00,r,insn1,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffac);
      }
      else {
        in_stack_ffffffffffffffb0 = insn3 & 0xff;
        in_stack_ffffffffffffffa8 = 0x24;
        BYTE_OUT1R5(s_00,r,insn1,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffac,src_00,uVar2);
      }
    }
    else if (iVar1 == 0) {
      BYTE_OUT3IR(s_01,rex_00,0,(int)((ulong)s_00 >> 0x20),(int)s_00,r);
    }
    else {
      in_stack_ffffffffffffffa8 = in_R8D & 7 | 0x20;
      BYTE_OUT1R4I(s_00,r,insn1,in_stack_ffffffffffffffb4,insn3,in_stack_ffffffffffffffac,src_00,
                   uVar2);
      in_stack_ffffffffffffffb0 = insn3;
    }
  }
  else if ((in_R9 == (dill_stream)0x0) && ((in_R8D & 7) != 5)) {
    if (iVar1 == 0) {
      BYTE_OUT2R(s_00,r,insn1,in_stack_ffffffffffffffb4);
    }
    else {
      BYTE_OUT1R3(s_00,r,insn1,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                  in_stack_ffffffffffffffac);
    }
  }
  else if (((long)in_R9 < 0x80) && (-0x80 < (long)in_R9)) {
    if (iVar1 == 0) {
      BYTE_OUT3R(s_00,r,insn1,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    }
    else {
      in_stack_ffffffffffffffa8 = insn3 & 0xff;
      BYTE_OUT1R4(s_00,r,insn1,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                  in_stack_ffffffffffffffac,src_00);
    }
  }
  else if ((((ulong)in_R9 & 0xffffffff80000000) == 0) ||
          (((ulong)in_R9 & 0xffffffff80000000) == 0xffffffff80000000)) {
    if (iVar1 == 0) {
      BYTE_OUT2IR(s_00,r,insn1,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    }
    else {
      BYTE_OUT1R3I(s_00,r,insn1,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffac,src_00);
      in_stack_ffffffffffffffa8 = insn3;
    }
  }
  else if (in_ECX == in_R8D) {
    x86_64_arith3i(in_R9,op,uVar2,(int)((ulong)s_01 >> 0x20),src_00,CONCAT44(rex_00,iVar1));
    x86_64_ploadi((dill_stream)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,(int)((ulong)in_R9 >> 0x20),
                  (int)in_R9,CONCAT44(op,uVar2));
  }
  else {
    x86_64_setl(s_00,r,CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    x86_64_pload((dill_stream)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,(int)((ulong)in_R9 >> 0x20),
                 (int)in_R9,op);
  }
  switch(in_ESI) {
  case 0:
    x86_64_lshi((dill_stream)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
    x86_64_rshai((dill_stream)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
    break;
  case 1:
  case 3:
    if (in_ECX != uVar2) {
      x86_64_pmov((dill_stream)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
    }
    break;
  case 2:
    x86_64_lshi((dill_stream)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
    x86_64_rshai((dill_stream)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
  }
  return;
}

Assistant:

extern void
x86_64_ploadi(dill_stream s,
              int type,
              int junk,
              int dest,
              int src,
              IMM_TYPE offset)
{
    unsigned char opcode = ld_opcodes[type];
    int tmp_dest = dest;
    x86_64_mach_info smi = (x86_64_mach_info)s->p->mach_info;
    int rex = 0;
    int float_op = 0;
    if ((type == DILL_L) || (type == DILL_UL) || (type == DILL_P)) {
        rex = REX_W;
    }
    switch (type) {
    case DILL_F:
        float_op = 0xf3;
        break;
    case DILL_D:
        float_op = 0xf2;
        break;
    case DILL_C:
    case DILL_UC:
        if (dest >= ESP) {
            /* movb doesn't work for big regs, load to eax */
            tmp_dest = EAX;
        }
        if (type == DILL_UC) {
            /* clear high bytes */
            if (src == tmp_dest) {
                /* don't destroy source */
                tmp_dest = EAX;
            }
            x86_64_clear(s, tmp_dest);
        }
        break;
    case DILL_S:
    case DILL_US:
        if (type == DILL_US) {
            /* clear high bytes */
            if (src == tmp_dest) {
                /* don't destroy source */
                tmp_dest = EAX;
            }
            x86_64_clear(s, tmp_dest);
        }
        BYTE_OUT1(s, 0x66);
        break;
    case DILL_L:
    case DILL_UL:
    case DILL_P:
    /* fall through */
    default:
        break;
    }
    if (smi->pending_prefix != 0) {
        BYTE_OUT1(s, smi->pending_prefix);
        smi->pending_prefix = 0;
    }
    if (src > RDI)
        rex |= REX_B;
    if (tmp_dest > RDI)
        rex |= REX_R;
    if (((0x7 & src) == RSP) &&
        (((offset & 0xffffffff80000000) == 0) ||
         ((offset & 0xffffffff80000000) == 0xffffffff80000000))) {
        /* must use SIB because ModRM has a discontinuity */
        if (offset == 0) {
            if (float_op != 0) {
                BYTE_OUT1R4(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x0, tmp_dest, 0x4), SIB(0, 4, src));
            } else {
                BYTE_OUT3R(s, rex, opcode, ModRM(0x0, tmp_dest, 0x4),
                           SIB(0, 4, src));
            }
        } else if (((intptr_t)offset <= 127) && ((intptr_t)offset > -128)) {
            if (float_op != 0) {
                BYTE_OUT1R5(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x1, tmp_dest, src), SIB(0, ESP, 0x4),
                            offset & 0xff);
            } else {
                BYTE_OUT4R(s, rex, opcode, ModRM(0x1, tmp_dest, src),
                           SIB(0, ESP, 0x4), offset & 0xff);
            }
        } else {
            if (float_op != 0) {
                BYTE_OUT1R4I(s, float_op, rex, 0x0f, 0x10,
                             ModRM(0x2, tmp_dest, 0x4), SIB(0, 4, src),
                             (int)offset);
            } else {
                BYTE_OUT3IR(s, rex, opcode, ModRM(0x2, tmp_dest, 0x4),
                            SIB(0, 4, src), (int)offset);
            }
        }
    } else {
        if ((offset == 0) &&
            ((src & 0x7) != 5)) { /* avoid discontinuity in ModRM */
            if (float_op != 0) {
                BYTE_OUT1R3(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x0, tmp_dest, src));
            } else {
                BYTE_OUT2R(s, rex, opcode, ModRM(0x0, tmp_dest, src));
            }
        } else if (((intptr_t)offset <= 127) && ((intptr_t)offset > -128)) {
            if (float_op != 0) {
                BYTE_OUT1R4(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x1, tmp_dest, src), offset & 0xff);
            } else {
                BYTE_OUT3R(s, rex, opcode, ModRM(0x1, tmp_dest, src),
                           offset & 0xff);
            }
        } else if (((offset & 0xffffffff80000000) == 0) ||
                   ((offset & 0xffffffff80000000) == 0xffffffff80000000)) {
            if (float_op != 0) {
                BYTE_OUT1R3I(s, float_op, rex, 0x0f, 0x10,
                             ModRM(0x2, tmp_dest, src), (int)offset);
            } else {
                BYTE_OUT2IR(s, rex, opcode, ModRM(0x2, tmp_dest, src),
                            (int)offset);
            }
        } else {
            /* really big offset */
            if (dest != src) {
                /* use dest since it'll be destroyed by the load */
                x86_64_setl(s, dest, offset);
                x86_64_pload(s, type, 0, dest, src, dest);
            } else {
                /* destroy src, but since it's the same as dest, it's lost
                 * anyway */
                x86_64_arith3i(s, 0, DILL_L, src, src, offset);
                x86_64_ploadi(s, type, 0, dest, src, 0);
            }
        }
    }
    switch (type) {
    case DILL_C:
        x86_64_lshi(s, dest, tmp_dest, 56);
        x86_64_rshai(s, dest, dest, 56);
        break;
    case DILL_S:
        x86_64_lshi(s, dest, tmp_dest, 48);
        x86_64_rshai(s, dest, dest, 48);
        break;
    case DILL_UC:
    case DILL_US:
        if (dest != tmp_dest)
            x86_64_movi(s, dest, tmp_dest);
        break;
    }
}